

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O1

bool bssl::dtls1_init_message(SSL *ssl,CBB *cbb,CBB *body,uint8_t type)

{
  int iVar1;
  
  iVar1 = CBB_init(cbb,0x40);
  if ((iVar1 != 0) && (iVar1 = CBB_add_u8(cbb,type), iVar1 != 0)) {
    iVar1 = CBB_add_u24(cbb,0);
    if (iVar1 == 0) {
      return false;
    }
    iVar1 = CBB_add_u16(cbb,ssl->d1->handshake_write_seq);
    if (iVar1 != 0) {
      iVar1 = CBB_add_u24(cbb,0);
      if (iVar1 == 0) {
        return false;
      }
      iVar1 = CBB_add_u24_length_prefixed(cbb,body);
      return iVar1 != 0;
    }
  }
  return false;
}

Assistant:

bool dtls1_init_message(const SSL *ssl, CBB *cbb, CBB *body, uint8_t type) {
  // Pick a modest size hint to save most of the |realloc| calls.
  if (!CBB_init(cbb, 64) ||                                   //
      !CBB_add_u8(cbb, type) ||                               //
      !CBB_add_u24(cbb, 0 /* length (filled in later) */) ||  //
      !CBB_add_u16(cbb, ssl->d1->handshake_write_seq) ||      //
      !CBB_add_u24(cbb, 0 /* offset */) ||                    //
      !CBB_add_u24_length_prefixed(cbb, body)) {
    return false;
  }

  return true;
}